

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O1

void Diligent::anon_unknown_61::ValidatePipelineResourceSignatures
               (PipelineStateCreateInfo *CreateInfo,IRenderDevice *pDevice)

{
  PipelineResourceLayoutDesc *LayoutDesc;
  _Hash_node_base *p_Var1;
  Uint32 *Args_6;
  undefined4 uVar2;
  SHADER_TYPE SVar3;
  SHADER_TYPE SVar4;
  __buckets_ptr pp_Var5;
  __node_type *p_Var6;
  Char *pCVar7;
  char *pcVar8;
  __node_base _Var9;
  __node_type *p_Var10;
  __node_type *p_Var11;
  ImmutableSamplerDesc *pIVar12;
  __node_type *p_Var13;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
  *p_Var14;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
  *p_Var15;
  bool bVar16;
  PipelineStateCreateInfo *pPVar17;
  size_type sVar18;
  size_type sVar19;
  int iVar20;
  uint uVar21;
  undefined4 extraout_var;
  Char **ppCVar23;
  char **ppcVar24;
  undefined4 extraout_var_00;
  _Hash_node_base *p_Var26;
  __node_base_ptr *__s;
  __node_base_ptr p_Var27;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false> _Var28;
  char **ppcVar29;
  __node_base_ptr *__s_00;
  __node_base_ptr p_Var30;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false> _Var31;
  __node_type *p_Var32;
  long lVar33;
  __node_type *p_Var34;
  char (*in_RCX) [19];
  __node_base *Args_1;
  __hash_code __code;
  __hash_code __code_00;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false> _Var35;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE ShaderStages_02;
  size_type sVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  __node_ptr __bkt;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false> _Var41;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
  extraout_RDX;
  __node_type *extraout_RDX_00;
  __node_type *extraout_RDX_01;
  __node_type *extraout_RDX_02;
  __node_type *extraout_RDX_03;
  ShaderResourceVariableDesc *pSVar42;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false> it;
  __node_base _Var43;
  char *pcVar44;
  _Hash_node_base _Var45;
  __node_ptr __n_00;
  _Hash_node_base _Var46;
  PipelineStateCreateInfo *pPVar47;
  __node_ptr __n;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false> this;
  bool bVar48;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>_>
  pVar49;
  undefined1 auVar50 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>_>
  pVar51;
  ShaderResourceVariableDesc SVar52;
  string msg_1;
  uint local_14c;
  PipelineStateCreateInfo *local_148;
  undefined8 local_140;
  Char **local_138;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false> local_130;
  char *local_128;
  String local_120;
  unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
  AllResources;
  unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
  AllImtblSamplers;
  array<const_Diligent::IPipelineResourceSignature_*,_8UL> ppSignatures;
  int *piVar22;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false> _Var25;
  
  pcVar44 = (char *)pDevice;
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)&ppSignatures,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])0x803899,in_RCX);
    pcVar44 = "ValidatePipelineResourceSignatures";
    DebugAssertionFailed
              ((Char *)ppSignatures._M_elems[0],"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xd3);
    if (ppSignatures._M_elems[0] != (IPipelineResourceSignature *)(ppSignatures._M_elems + 2)) {
      pcVar44 = (char *)((long)&(ppSignatures._M_elems[2]->super_IDeviceObject).super_IObject.
                                _vptr_IObject + 1);
      operator_delete(ppSignatures._M_elems[0],(ulong)pcVar44);
    }
  }
  iVar20 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  piVar22 = (int *)CONCAT44(extraout_var,iVar20);
  if ((byte *)CreateInfo->pInternalData == (byte *)0x0) {
    bVar48 = true;
  }
  else {
    bVar48 = (*CreateInfo->pInternalData & 1) == 0;
  }
  if ((!bVar48) && (CreateInfo->ResourceSignaturesCount != 1)) {
    ppSignatures._M_elems[0] =
         (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
    pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
    AllResources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
    if (pp_Var5 != (__buckets_ptr)0x0) {
      AllResources._M_h._M_buckets = pp_Var5;
    }
    pcVar44 = "ValidatePipelineResourceSignatures";
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[89],unsigned_int,char[13]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xdd,(char (*) [16])"Description of ",(char **)&ppSignatures,(char (*) [7])0x82578a,
               (char **)&AllResources,(char (*) [15])"\' is invalid: ",
               (char (*) [89])
               "When PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0 flag is set, ResourceSignaturesCount ("
               ,&CreateInfo->ResourceSignaturesCount,(char (*) [13])") must be 1.");
  }
  Args_6 = &CreateInfo->ResourceSignaturesCount;
  if ((CreateInfo->ResourceSignaturesCount != 0) &&
     (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
    ppSignatures._M_elems[0] =
         (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
    pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
    AllResources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
    if (pp_Var5 != (__buckets_ptr)0x0) {
      AllResources._M_h._M_buckets = pp_Var5;
    }
    pcVar44 = "ValidatePipelineResourceSignatures";
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[60],unsigned_int,char[15]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xe0,(char (*) [16])"Description of ",(char **)&ppSignatures,(char (*) [7])0x82578a,
               (char **)&AllResources,(char (*) [15])"\' is invalid: ",
               (char (*) [60])"ppResourceSignatures is null, but ResourceSignaturesCount (",Args_6,
               (char (*) [15])") is not zero.");
  }
  if ((CreateInfo->ppResourceSignatures != (IPipelineResourceSignature **)0x0) &&
     (CreateInfo->ResourceSignaturesCount == 0)) {
    ppSignatures._M_elems[0] =
         (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
    pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
    AllResources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
    if (pp_Var5 != (__buckets_ptr)0x0) {
      AllResources._M_h._M_buckets = pp_Var5;
    }
    pcVar44 = "ValidatePipelineResourceSignatures";
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[71]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xe3,(char (*) [16])"Description of ",(char **)&ppSignatures,(char (*) [7])0x82578a,
               (char **)&AllResources,(char (*) [15])"\' is invalid: ",
               (char (*) [71])
               "ppResourceSignatures is not null, but ResourceSignaturesCount is zero.");
  }
  if (CreateInfo->ppResourceSignatures != (IPipelineResourceSignature **)0x0) {
    if ((CreateInfo->PSODesc).SRBAllocationGranularity != 1) {
      pcVar44 = 
      "PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning."
      ;
      FormatString<char[135]>
                ((string *)&ppSignatures,
                 (char (*) [135])
                 "PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        pcVar44 = (char *)ppSignatures._M_elems[0];
        (*(code *)DebugMessageCallback)(1,ppSignatures._M_elems[0],0,0);
      }
      if (ppSignatures._M_elems[0] != (IPipelineResourceSignature *)(ppSignatures._M_elems + 2)) {
        pcVar44 = (char *)((long)&(ppSignatures._M_elems[2]->super_IDeviceObject).super_IObject.
                                  _vptr_IObject + 1);
        operator_delete(ppSignatures._M_elems[0],(ulong)pcVar44);
      }
    }
    if (bVar48) {
      if ((CreateInfo->PSODesc).ResourceLayout.NumVariables != 0) {
        ppSignatures._M_elems[0] =
             (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType)
        ;
        pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        AllResources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        if (pp_Var5 != (__buckets_ptr)0x0) {
          AllResources._M_h._M_buckets = pp_Var5;
        }
        pcVar44 = "ValidatePipelineResourceSignatures";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[58],unsigned_int,char[50]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xf2,(char (*) [16])"Description of ",(char **)&ppSignatures,
                   (char (*) [7])0x82578a,(char **)&AllResources,(char (*) [15])"\' is invalid: ",
                   (char (*) [58])"The number of variables defined through resource layout (",
                   &(CreateInfo->PSODesc).ResourceLayout.NumVariables,
                   (char (*) [50])") must be zero when resource signatures are used.");
      }
      if ((CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers != 0) {
        ppSignatures._M_elems[0] =
             (IPipelineResourceSignature *)GetPipelineTypeString((CreateInfo->PSODesc).PipelineType)
        ;
        pp_Var5 = (__buckets_ptr)(CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
        AllResources._M_h._M_buckets = (__buckets_ptr)0x8048f6;
        if (pp_Var5 != (__buckets_ptr)0x0) {
          AllResources._M_h._M_buckets = pp_Var5;
        }
        pcVar44 = "ValidatePipelineResourceSignatures";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[67],unsigned_int,char[50]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xf8,(char (*) [16])"Description of ",(char **)&ppSignatures,
                   (char (*) [7])0x82578a,(char **)&AllResources,(char (*) [15])"\' is invalid: ",
                   (char (*) [67])
                   "The number of immutable samplers defined through resource layout (",
                   &(CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers,
                   (char (*) [50])") must be zero when resource signatures are used.");
      }
    }
    AllResources._M_h._M_buckets = &AllResources._M_h._M_single_bucket;
    AllResources._M_h._M_bucket_count = 1;
    AllResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllResources._M_h._M_element_count = 0;
    AllResources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    AllResources._M_h._M_rehash_policy._M_next_resize = 0;
    AllResources._M_h._M_single_bucket = (__node_base_ptr)0x0;
    AllImtblSamplers._M_h._M_buckets = &AllImtblSamplers._M_h._M_single_bucket;
    AllImtblSamplers._M_h._M_bucket_count = 1;
    AllImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllImtblSamplers._M_h._M_element_count = 0;
    AllImtblSamplers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    AllImtblSamplers._M_h._M_rehash_policy._M_next_resize = 0;
    AllImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ppSignatures._M_elems[6] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[7] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[4] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[5] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[2] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[3] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[0] = (IPipelineResourceSignature *)0x0;
    ppSignatures._M_elems[1] = (IPipelineResourceSignature *)0x0;
    local_140 = (char *)((ulong)local_140._4_4_ << 0x20);
    local_148 = CreateInfo;
    if (*Args_6 != 0) {
      uVar21 = 0;
      do {
        Args_1 = (__node_base *)CreateInfo->ppResourceSignatures;
        p_Var6 = (__node_type *)Args_1[uVar21]._M_nxt;
        if (p_Var6 == (__node_type *)0x0) {
          msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (local_120._M_dataplus._M_p == (char *)0x0) {
            local_120._M_dataplus._M_p = "";
          }
          pcVar44 = "ValidatePipelineResourceSignatures";
          Args_1 = (__node_base *)0x111;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[38],unsigned_int,char[9]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x111,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x82578a,
                     (char **)&local_120,(char (*) [15])"\' is invalid: ",
                     (char (*) [38])"Pipeline resource signature at index ",(uint *)&local_140,
                     (char (*) [9])0x83d5a9);
        }
        ppCVar23 = (Char **)(*(code *)(p_Var6->super__Hash_node_base)._M_nxt[4]._M_nxt)(p_Var6);
        if (7 < *(byte *)((long)ppCVar23 + 0x24)) {
          FormatString<char[127]>
                    (&msg_1,(char (*) [127])
                            "Resource signature binding index exceeds the limit. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc."
                    );
          pcVar44 = "ValidatePipelineResourceSignatures";
          Args_1 = (__node_base *)0x115;
          DebugAssertionFailed
                    (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x115);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
            pcVar44 = (char *)(msg_1.field_2._M_allocated_capacity + 1);
            operator_delete(msg_1._M_dataplus._M_p,(ulong)pcVar44);
          }
        }
        if (ppSignatures._M_elems[*(byte *)((long)ppCVar23 + 0x24)] !=
            (IPipelineResourceSignature *)0x0) {
          msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
          local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
          if (local_120._M_dataplus._M_p == (char *)0x0) {
            local_120._M_dataplus._M_p = "";
          }
          ppcVar24 = (char **)(*(code *)(p_Var6->super__Hash_node_base)._M_nxt[4]._M_nxt)(p_Var6);
          local_128 = (char *)CONCAT44(local_128._4_4_,(uint)*(byte *)((long)ppCVar23 + 0x24));
          iVar20 = (*(ppSignatures._M_elems[*(byte *)((long)ppCVar23 + 0x24)]->super_IDeviceObject).
                     super_IObject._vptr_IObject[4])();
          pcVar44 = "ValidatePipelineResourceSignatures";
          Args_1 = (__node_base *)0x11b;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[30],char_const*,char[20],unsigned_int,char[45],char_const*,char[28]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x11b,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x82578a,
                     (char **)&local_120,(char (*) [15])"\' is invalid: ",
                     (char (*) [30])"Pipeline resource signature \'",ppcVar24,
                     (char (*) [20])"\' at binding index ",(uint *)&local_128,
                     (char (*) [45])" conflicts with another resource signature \'",
                     (char **)CONCAT44(extraout_var_00,iVar20),
                     (char (*) [28])"\' that uses the same index.");
        }
        ppSignatures._M_elems[*(byte *)((long)ppCVar23 + 0x24)] =
             (IPipelineResourceSignature *)p_Var6;
        local_138 = ppCVar23;
        local_130._M_cur = p_Var6;
        if (*(int *)(ppCVar23 + 2) != 0) {
          pcVar44 = (char *)0x0;
          do {
            pCVar7 = (((SamplerDesc *)(local_138 + 1))->super_DeviceObjectAttribs).Name;
            pcVar8 = *(char **)(pCVar7 + (long)pcVar44 * 0x18);
            if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
              FormatString<char[108]>
                        (&msg_1,(char (*) [108])
                                "Resource name can\'t be null or empty. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              Args_1 = (__node_base *)0x122;
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x122);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
              }
            }
            p_Var1 = (_Hash_node_base *)(pCVar7 + (long)pcVar44 * 0x18);
            if (*(int *)&p_Var1[1]._M_nxt == 0) {
              FormatString<char[102]>
                        (&msg_1,(char (*) [102])
                                "Shader stages can\'t be UNKNOWN. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              Args_1 = (__node_base *)0x123;
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x123);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
              }
            }
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)&msg_1,(Char *)p_Var1->_M_nxt,false);
            pVar49 = std::
                     unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                     ::equal_range(&AllResources,(key_type *)&msg_1);
            _Var25._M_cur =
                 (__node_type *)
                 pVar49.first.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                 ._M_cur;
            if ((msg_1._M_dataplus._M_p != (pointer)0x0) && ((long)msg_1._M_string_length < 0)) {
              operator_delete__(msg_1._M_dataplus._M_p);
            }
            for (; (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                    )_Var25._M_cur !=
                   pVar49.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                ; _Var25._M_cur = (__node_type *)((_Var25._M_cur)->super__Hash_node_base)._M_nxt) {
              if ((*(uint *)((long)&((_Var25._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                    ._M_storage._M_storage + 0x10) & *(uint *)&p_Var1[1]._M_nxt) !=
                  0) {
                if (*(__node_type **)
                     ((long)&((_Var25._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                             ._M_storage._M_storage + 0x18) == local_130._M_cur) {
                  FormatString<char[104]>
                            (&msg_1,(char (*) [104])
                                    "Overlapping resources in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                            );
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,299);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                ppcVar24 = (char **)(**(code **)(**(long **)((long)&((_Var25._M_cur)->
                                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
                Args_1 = (__node_base *)0x12f;
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[18],char_const*,char[50],char_const*,char[8],char_const*,char[124]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x12f,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x82578a,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",(char (*) [18])"Shader resource \'",
                           (char **)p_Var1,
                           (char (*) [50])"\' is found in more than one resource signature (\'",
                           local_138,(char (*) [8])"\' and \'",ppcVar24,
                           (char (*) [124])
                           "\') in the same shader stage. Every shader resource in the PSO must be unambiguously defined by only one resource signature."
                          );
              }
              if ((char)piVar22[3] == '\0') {
                if (*(int *)((long)&((_Var25._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                    ._M_storage._M_storage + 0x10) == 0) {
                  FormatString<char[26],char[39]>
                            (&msg_1,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])"OtherRes.Stages != SHADER_TYPE_UNKNOWN",
                             (char (*) [39])Args_1);
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x134);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                if (*(__node_type **)
                     ((long)&((_Var25._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                             ._M_storage._M_storage + 0x18) == local_130._M_cur) {
                  FormatString<char[111]>
                            (&msg_1,(char (*) [111])
                                    "Resources with the same name in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                            );
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x135);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                ppcVar24 = (char **)(**(code **)(**(long **)((long)&((_Var25._M_cur)->
                                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
                Args_1 = (__node_base *)0x13a;
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[71],char_const*,char[50],char_const*,char[8],char_const*,char[206]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x13a,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x82578a,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",
                           (char (*) [71])
                           "This device does not support separable programs, but shader resource \'"
                           ,(char **)p_Var1,
                           (char (*) [50])"\' is found in more than one resource signature (\'",
                           local_138,(char (*) [8])"\' and \'",ppcVar24,
                           (char (*) [206])
                           "\') in different stages. When separable programs are not supported, every resource is always shared between all stages. Use distinct resource names for each stage or define a single resource for all stages."
                          );
              }
            }
            uVar2 = *(undefined4 *)&p_Var1[1]._M_nxt;
            p_Var26 = (_Hash_node_base *)operator_new(0x30);
            p_Var26->_M_nxt = (_Hash_node_base *)0x0;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)(p_Var26 + 1),(Char *)p_Var1->_M_nxt,false);
            *(undefined4 *)&p_Var26[3]._M_nxt = uVar2;
            p_Var26[4]._M_nxt = &(local_130._M_cur)->super__Hash_node_base;
            p_Var26[5]._M_nxt = p_Var1;
            p_Var1 = p_Var26[2]._M_nxt;
            __code = 1;
            auVar50 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)&AllResources._M_h._M_rehash_policy,
                                 AllResources._M_h._M_bucket_count,
                                 AllResources._M_h._M_element_count);
            sVar36 = auVar50._8_8_;
            __s = AllResources._M_h._M_buckets;
            sVar18 = AllResources._M_h._M_bucket_count;
            if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (sVar36 == 1) {
                AllResources._M_h._M_single_bucket = (__node_base_ptr)0x0;
                __s = &AllResources._M_h._M_single_bucket;
              }
              else {
                __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                ((new_allocator<std::__detail::_Hash_node_base_*> *)&msg_1,sVar36,
                                 (void *)0x0);
                memset(__s,0,sVar36 * 8);
              }
              _Var43._M_nxt = AllResources._M_h._M_before_begin._M_nxt;
              AllResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              if (_Var43._M_nxt == (_Hash_node_base *)0x0) {
                bVar16 = false;
                _Var45._M_nxt = (_Hash_node_base *)0x0;
                __code = 0;
              }
              else {
                bVar16 = false;
                uVar38 = 0;
                _Var46._M_nxt = (_Hash_node_base *)(__node_base_ptr *)0x0;
                uVar40 = 0;
                do {
                  _Var45._M_nxt = _Var43._M_nxt;
                  _Var43._M_nxt = (_Var45._M_nxt)->_M_nxt;
                  __code = ((ulong)_Var45._M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar36;
                  if ((_Var46._M_nxt == (_Hash_node_base *)0x0) || (uVar40 != __code)) {
                    if (bVar16) {
                      if ((_Var46._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                        bVar16 = false;
                        uVar37 = ((ulong)(_Var46._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) %
                                 sVar36;
                        if (uVar37 == uVar40) goto LAB_006c627a;
                        __s[uVar37] = _Var46._M_nxt;
                      }
                      bVar16 = false;
                    }
LAB_006c627a:
                    if (__s[__code] != (_Hash_node_base *)0x0) {
                      (_Var45._M_nxt)->_M_nxt = __s[__code]->_M_nxt;
                      _Var46._M_nxt = __s[__code];
                      goto LAB_006c62bb;
                    }
                    (_Var45._M_nxt)->_M_nxt = AllResources._M_h._M_before_begin._M_nxt;
                    __s[__code] = &AllResources._M_h._M_before_begin;
                    uVar40 = __code;
                    AllResources._M_h._M_before_begin._M_nxt = _Var45._M_nxt;
                    if ((_Var45._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                      _Var46._M_nxt = (_Hash_node_base *)(__s + uVar38);
                      uVar38 = __code;
                      goto LAB_006c62bb;
                    }
                  }
                  else {
                    (_Var45._M_nxt)->_M_nxt = (_Var46._M_nxt)->_M_nxt;
                    bVar16 = true;
LAB_006c62bb:
                    *_Var46._M_nxt = (_Hash_node_base)_Var45._M_nxt;
                    uVar40 = uVar38;
                  }
                  uVar38 = uVar40;
                  _Var46._M_nxt = _Var45._M_nxt;
                  uVar40 = __code;
                } while (_Var43._M_nxt != (_Hash_node_base *)0x0);
              }
              if (((bVar16) && ((_Var45._M_nxt)->_M_nxt != (_Hash_node_base *)0x0)) &&
                 (uVar38 = ((ulong)(_Var45._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar36,
                 uVar38 != __code)) {
                __s[uVar38] = _Var45._M_nxt;
              }
              sVar18 = sVar36;
              if (&AllResources._M_h._M_single_bucket != AllResources._M_h._M_buckets) {
                operator_delete(AllResources._M_h._M_buckets,AllResources._M_h._M_bucket_count << 3)
                ;
              }
            }
            AllResources._M_h._M_bucket_count = sVar18;
            AllResources._M_h._M_buckets = __s;
            uVar38 = ((ulong)p_Var1 & 0x7fffffffffffffff) % AllResources._M_h._M_bucket_count;
            p_Var27 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                      ::_M_find_before_node
                                (&AllResources._M_h,uVar38,(HashMapStringKey *)(p_Var26 + 1),__code)
            ;
            if (p_Var27 == (__node_base_ptr)0x0) {
              if (AllResources._M_h._M_buckets[uVar38] == (__node_base_ptr)0x0) {
                p_Var26->_M_nxt = AllResources._M_h._M_before_begin._M_nxt;
                if (AllResources._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
                  AllResources._M_h._M_buckets
                  [((ulong)AllResources._M_h._M_before_begin._M_nxt[2]._M_nxt & 0x7fffffffffffffff)
                   % AllResources._M_h._M_bucket_count] = p_Var26;
                }
                Args_1 = &AllResources._M_h._M_before_begin;
                AllResources._M_h._M_buckets[uVar38] = Args_1;
                AllResources._M_h._M_before_begin._M_nxt = p_Var26;
              }
              else {
                p_Var26->_M_nxt = AllResources._M_h._M_buckets[uVar38]->_M_nxt;
                AllResources._M_h._M_buckets[uVar38]->_M_nxt = p_Var26;
                Args_1 = (__node_base *)AllResources._M_h._M_buckets;
              }
            }
            else {
              Args_1 = p_Var27->_M_nxt;
              p_Var26->_M_nxt = Args_1;
              p_Var27->_M_nxt = p_Var26;
            }
            AllResources._M_h._M_element_count = AllResources._M_h._M_element_count + 1;
            pcVar44 = (char *)((long)&(((__node_ptr)pcVar44)->super__Hash_node_base)._M_nxt + 1);
            CreateInfo = local_148;
          } while (pcVar44 < (__node_ptr)(ulong)*(uint *)(local_138 + 2));
        }
        if (*(int *)(local_138 + 4) != 0) {
          uVar38 = 0;
          do {
            lVar33 = (long)local_138[3];
            pcVar44 = *(char **)(lVar33 + 8 + uVar38 * 0x48);
            if ((pcVar44 == (char *)0x0) || (*pcVar44 == '\0')) {
              FormatString<char[107]>
                        (&msg_1,(char (*) [107])
                                "Sampler name can\'t be null or empty. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              Args_1 = (__node_base *)0x143;
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x143);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
              }
            }
            p_Var1 = (_Hash_node_base *)(lVar33 + uVar38 * 0x48);
            if (*(int *)&p_Var1->_M_nxt == 0) {
              FormatString<char[101]>
                        (&msg_1,(char (*) [101])
                                "Shader stage can\'t be UNKNOWN. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              Args_1 = (__node_base *)0x144;
              DebugAssertionFailed
                        (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x144);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
              }
            }
            ppcVar24 = (char **)(lVar33 + uVar38 * 0x48 + 8);
            HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,*ppcVar24,false);
            pVar51 = std::
                     unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                     ::equal_range(&AllImtblSamplers,(key_type *)&msg_1);
            _Var28._M_cur =
                 (__node_type *)
                 pVar51.first.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                 ._M_cur;
            if ((msg_1._M_dataplus._M_p != (pointer)0x0) && ((long)msg_1._M_string_length < 0)) {
              operator_delete__(msg_1._M_dataplus._M_p);
            }
            for (; (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                    )_Var28._M_cur !=
                   pVar51.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                ; _Var28._M_cur = (__node_type *)((_Var28._M_cur)->super__Hash_node_base)._M_nxt) {
              if ((*(uint *)((long)&((_Var28._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                    ._M_storage._M_storage + 0x10) & *(uint *)&p_Var1->_M_nxt) != 0)
              {
                if (*(__node_type **)
                     ((long)&((_Var28._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                             ._M_storage._M_storage + 0x18) == local_130._M_cur) {
                  FormatString<char[113]>
                            (&msg_1,(char (*) [113])
                                    "Overlapping immutable samplers in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                            );
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x14c);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                ppcVar29 = (char **)(**(code **)(**(long **)((long)&((_Var28._M_cur)->
                                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
                Args_1 = (__node_base *)0x150;
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],char_const*,char[50],char_const*,char[8],char_const*,char[119]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x150,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x82578a,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",(char (*) [20])"Immutable sampler \'",
                           ppcVar24,(char (*) [50])
                                    "\' is found in more than one resource signature (\'",local_138,
                           (char (*) [8])"\' and \'",ppcVar29,
                           (char (*) [119])
                           "\') in the same stage. Every immutable sampler in the PSO must be unambiguously defined by only one resource signature."
                          );
              }
              if ((char)piVar22[3] == '\0') {
                if (*(int *)((long)&((_Var28._M_cur)->
                                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                    ._M_storage._M_storage + 0x10) == 0) {
                  FormatString<char[26],char[39]>
                            (&msg_1,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])"OtherSam.Stages != SHADER_TYPE_UNKNOWN",
                             (char (*) [39])Args_1);
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x155);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                if (*(__node_type **)
                     ((long)&((_Var28._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                             ._M_storage._M_storage + 0x18) == local_130._M_cur) {
                  FormatString<char[120]>
                            (&msg_1,(char (*) [120])
                                    "Immutable samplers with the same name in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                            );
                  DebugAssertionFailed
                            (msg_1._M_dataplus._M_p,"ValidatePipelineResourceSignatures",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                             ,0x156);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                    operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  }
                }
                msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                ppcVar29 = (char **)(**(code **)(**(long **)((long)&((_Var28._M_cur)->
                                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                                  ._M_storage._M_storage + 0x18) + 0x20))();
                Args_1 = (__node_base *)0x15b;
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[73],char_const*,char[50],char_const*,char[8],char_const*,char[215]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x15b,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x82578a,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",
                           (char (*) [73])
                           "This device does not support separable programs, but immutable sampler \'"
                           ,ppcVar24,
                           (char (*) [50])"\' is found in more than one resource signature (\'",
                           local_138,(char (*) [8])"\' and \'",ppcVar29,
                           (char (*) [215])
                           "\') in different stages. When separable programs are not supported, every resource is always shared between all stages. Use distinct resource names for each stage or define a single immutable sampler for all stages."
                          );
              }
            }
            uVar2 = *(undefined4 *)&p_Var1->_M_nxt;
            p_Var26 = (_Hash_node_base *)operator_new(0x30);
            p_Var26->_M_nxt = (_Hash_node_base *)0x0;
            HashMapStringKey::HashMapStringKey((HashMapStringKey *)(p_Var26 + 1),*ppcVar24,false);
            *(undefined4 *)&p_Var26[3]._M_nxt = uVar2;
            p_Var26[4]._M_nxt = &(local_130._M_cur)->super__Hash_node_base;
            p_Var26[5]._M_nxt = p_Var1;
            p_Var1 = p_Var26[2]._M_nxt;
            __code_00 = 1;
            auVar50 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)&AllImtblSamplers._M_h._M_rehash_policy,
                                 AllImtblSamplers._M_h._M_bucket_count,
                                 AllImtblSamplers._M_h._M_element_count);
            sVar36 = auVar50._8_8_;
            __s_00 = AllImtblSamplers._M_h._M_buckets;
            sVar19 = AllImtblSamplers._M_h._M_bucket_count;
            if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (sVar36 == 1) {
                AllImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
                __s_00 = &AllImtblSamplers._M_h._M_single_bucket;
              }
              else {
                __s_00 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                   ((new_allocator<std::__detail::_Hash_node_base_*> *)&msg_1,sVar36
                                    ,(void *)0x0);
                memset(__s_00,0,sVar36 * 8);
              }
              _Var9._M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
              AllImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              if (_Var9._M_nxt == (_Hash_node_base *)0x0) {
                bVar16 = false;
                _Var45._M_nxt = (_Hash_node_base *)0x0;
                __code_00 = 0;
              }
              else {
                bVar16 = false;
                uVar40 = 0;
                _Var46._M_nxt = (_Hash_node_base *)(__node_base_ptr *)0x0;
                uVar37 = 0;
                do {
                  _Var45._M_nxt = _Var9._M_nxt;
                  _Var9._M_nxt = (_Var45._M_nxt)->_M_nxt;
                  __code_00 = ((ulong)_Var45._M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar36;
                  if ((_Var46._M_nxt == (_Hash_node_base *)0x0) || (uVar37 != __code_00)) {
                    if (bVar16) {
                      if ((_Var46._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                        bVar16 = false;
                        uVar39 = ((ulong)(_Var46._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) %
                                 sVar36;
                        if (uVar39 == uVar37) goto LAB_006c6905;
                        __s_00[uVar39] = _Var46._M_nxt;
                      }
                      bVar16 = false;
                    }
LAB_006c6905:
                    if (__s_00[__code_00] != (_Hash_node_base *)0x0) {
                      (_Var45._M_nxt)->_M_nxt = __s_00[__code_00]->_M_nxt;
                      _Var46._M_nxt = __s_00[__code_00];
                      goto LAB_006c6946;
                    }
                    (_Var45._M_nxt)->_M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
                    AllImtblSamplers._M_h._M_before_begin._M_nxt = _Var45._M_nxt;
                    __s_00[__code_00] = &AllImtblSamplers._M_h._M_before_begin;
                    uVar37 = __code_00;
                    if ((_Var45._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                      _Var46._M_nxt = (_Hash_node_base *)(__s_00 + uVar40);
                      uVar40 = __code_00;
                      goto LAB_006c6946;
                    }
                  }
                  else {
                    (_Var45._M_nxt)->_M_nxt = (_Var46._M_nxt)->_M_nxt;
                    bVar16 = true;
LAB_006c6946:
                    *_Var46._M_nxt = (_Hash_node_base)_Var45._M_nxt;
                    uVar37 = uVar40;
                  }
                  uVar40 = uVar37;
                  _Var46._M_nxt = _Var45._M_nxt;
                  uVar37 = __code_00;
                } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
              }
              if (((bVar16) && ((_Var45._M_nxt)->_M_nxt != (_Hash_node_base *)0x0)) &&
                 (uVar40 = ((ulong)(_Var45._M_nxt)->_M_nxt[2]._M_nxt & 0x7fffffffffffffff) % sVar36,
                 uVar40 != __code_00)) {
                __s_00[uVar40] = _Var45._M_nxt;
              }
              sVar19 = sVar36;
              if (&AllImtblSamplers._M_h._M_single_bucket != AllImtblSamplers._M_h._M_buckets) {
                operator_delete(AllImtblSamplers._M_h._M_buckets,
                                AllImtblSamplers._M_h._M_bucket_count << 3);
              }
            }
            AllImtblSamplers._M_h._M_bucket_count = sVar19;
            AllImtblSamplers._M_h._M_buckets = __s_00;
            __bkt = (__node_ptr)
                    (((ulong)p_Var1 & 0x7fffffffffffffff) % AllImtblSamplers._M_h._M_bucket_count);
            pcVar44 = (char *)__bkt;
            p_Var30 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                      ::_M_find_before_node
                                (&AllImtblSamplers._M_h,(size_type)__bkt,
                                 (HashMapStringKey *)(p_Var26 + 1),__code_00);
            if (p_Var30 == (__node_base_ptr)0x0) {
              if (AllImtblSamplers._M_h._M_buckets[(long)__bkt] == (__node_base_ptr)0x0) {
                p_Var26->_M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
                if (AllImtblSamplers._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
                  AllImtblSamplers._M_h._M_buckets
                  [((ulong)AllImtblSamplers._M_h._M_before_begin._M_nxt[2]._M_nxt &
                   0x7fffffffffffffff) % AllImtblSamplers._M_h._M_bucket_count] = p_Var26;
                }
                Args_1 = &AllImtblSamplers._M_h._M_before_begin;
                AllImtblSamplers._M_h._M_buckets[(long)__bkt] = Args_1;
                AllImtblSamplers._M_h._M_before_begin._M_nxt = p_Var26;
              }
              else {
                p_Var26->_M_nxt = AllImtblSamplers._M_h._M_buckets[(long)__bkt]->_M_nxt;
                AllImtblSamplers._M_h._M_buckets[(long)__bkt]->_M_nxt = p_Var26;
                Args_1 = (__node_base *)AllImtblSamplers._M_h._M_buckets;
              }
            }
            else {
              Args_1 = p_Var30->_M_nxt;
              p_Var26->_M_nxt = Args_1;
              p_Var30->_M_nxt = p_Var26;
            }
            AllImtblSamplers._M_h._M_element_count = AllImtblSamplers._M_h._M_element_count + 1;
            uVar38 = uVar38 + 1;
            CreateInfo = local_148;
          } while (uVar38 < *(uint *)(local_138 + 4));
        }
        uVar21 = (uint)local_140 + 1;
        local_140 = (char *)CONCAT44(local_140._4_4_,uVar21);
      } while (uVar21 < *Args_6);
    }
    _Var9._M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
    if ((!bVar48) && (1 < *piVar22 - 3U)) {
      local_14c = 0;
      if ((CreateInfo->PSODesc).ResourceLayout.NumVariables != 0) {
        uVar38 = 0;
        do {
          pcVar44 = (char *)&msg_1;
          pSVar42 = (CreateInfo->PSODesc).ResourceLayout.Variables;
          if (pSVar42[uVar38].Name == (Char *)0x0) {
            msg_1._M_dataplus._M_p = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
            local_120._M_dataplus._M_p = (CreateInfo->PSODesc).super_DeviceObjectAttribs.Name;
            if (local_120._M_dataplus._M_p == (char *)0x0) {
              local_120._M_dataplus._M_p = "";
            }
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[15]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x16c,(char (*) [16])"Description of ",(char **)pcVar44,
                       (char (*) [7])0x82578a,(char **)&local_120,(char (*) [15])"\' is invalid: ",
                       (char (*) [26])"ResourceLayout.Variables[",&local_14c,
                       (char (*) [15])"].Name is null");
          }
          pSVar42 = pSVar42 + uVar38;
          HashMapStringKey::HashMapStringKey((HashMapStringKey *)pcVar44,pSVar42->Name,false);
          pVar49 = std::
                   unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                   ::equal_range(&AllResources,(key_type *)pcVar44);
          _Var41 = pVar49.second.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                   ._M_cur;
          _Var31 = pVar49.first.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                   ._M_cur;
          if ((msg_1._M_dataplus._M_p != (pointer)0x0) && ((long)msg_1._M_string_length < 0)) {
            operator_delete__(msg_1._M_dataplus._M_p);
            pVar49.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
            ._M_cur = extraout_RDX.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                      ._M_cur;
            pVar49.first.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
            ._M_cur = _Var31.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                      ._M_cur;
          }
          while( true ) {
            pPVar47 = local_148;
            _Var25._M_cur =
                 (__node_type *)
                 pVar49.second.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                 ._M_cur;
            this._M_cur = (__node_type *)
                          pVar49.first.
                          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                          ._M_cur;
            if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                 )this._M_cur ==
                _Var41.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                ._M_cur) break;
            SVar3 = *(SHADER_TYPE *)
                     ((long)&((this._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                             ._M_storage._M_storage + 0x10);
            SVar4 = pSVar42->ShaderStages;
            if ((SVar4 & SVar3) != SHADER_TYPE_UNKNOWN) {
              if (SVar3 != SVar4) {
                local_140 = GetPipelineTypeString((local_148->PSODesc).PipelineType);
                local_128 = (pPVar47->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_128 == (char *)0x0) {
                  local_128 = "";
                }
                GetShaderStagesString_abi_cxx11_
                          (&msg_1,(Diligent *)(ulong)pSVar42->ShaderStages,ShaderStages);
                GetShaderStagesString_abi_cxx11_
                          (&local_120,
                           (Diligent *)
                           (ulong)*(uint *)((long)&((this._M_cur)->
                                                                                                      
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x10),ShaderStages_00);
                pcVar44 = "ValidatePipelineResourceSignatures";
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[28],char_const*,char[35],std::__cxx11::string,char[71],std::__cxx11::string,char[73]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x17a,(char (*) [16])"Description of ",(char **)&local_140,
                           (char (*) [7])0x82578a,&local_128,(char (*) [15])"\' is invalid: ",
                           (char (*) [28])"Shader stages of variable \'",&pSVar42->Name,
                           (char (*) [35])"\' defined by the resource layout (",&msg_1,
                           (char (*) [71])
                           ") do not match the stages defined by the implicit resource signature (",
                           &local_120,
                           (char (*) [73])
                           "). This might indicate a bug in the serialization/deserialization logic."
                          );
                _Var25._M_cur = extraout_RDX_00;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
                  pcVar44 = (char *)(local_120.field_2._M_allocated_capacity + 1);
                  operator_delete(local_120._M_dataplus._M_p,(ulong)pcVar44);
                  _Var25._M_cur = extraout_RDX_01;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                  pcVar44 = (char *)(msg_1.field_2._M_allocated_capacity + 1);
                  operator_delete(msg_1._M_dataplus._M_p,(ulong)pcVar44);
                  _Var25._M_cur = extraout_RDX_02;
                }
              }
              pPVar47 = local_148;
              if (*(SHADER_RESOURCE_VARIABLE_TYPE *)
                   (*(long *)((long)&((this._M_cur)->
                                     super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                     ._M_storage._M_storage + 0x20) + 0x11) != pSVar42->Type) {
                msg_1._M_dataplus._M_p = GetPipelineTypeString((local_148->PSODesc).PipelineType);
                local_120._M_dataplus._M_p = (pPVar47->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_120._M_dataplus._M_p == (char *)0x0) {
                  local_120._M_dataplus._M_p = "";
                }
                local_140 = GetShaderVariableTypeLiteralName(pSVar42->Type,false);
                local_128 = GetShaderVariableTypeLiteralName
                                      (*(SHADER_RESOURCE_VARIABLE_TYPE *)
                                        (*(long *)((long)&((this._M_cur)->
                                                                                                                    
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                                  ._M_storage._M_storage + 0x20) + 0x11),false);
                pcVar44 = "ValidatePipelineResourceSignatures";
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[35],char_const*,char[71],char_const*,char[73]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x181,(char (*) [16])"Description of ",(char **)&msg_1,
                           (char (*) [7])0x82578a,(char **)&local_120,
                           (char (*) [15])"\' is invalid: ",(char (*) [23])"The type of variable \'"
                           ,&pSVar42->Name,(char (*) [35])"\' defined by the resource layout (",
                           (char **)&local_140,
                           (char (*) [71])
                           ") does not match the type defined by the implicit resource signature (",
                           &local_128,
                           (char (*) [73])
                           "). This might indicate a bug in the serialization/deserialization logic."
                          );
                _Var25._M_cur = extraout_RDX_03;
              }
              if ((SVar4 & SVar3) != SHADER_TYPE_UNKNOWN) break;
            }
            pVar49.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                       )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                         )_Var25._M_cur;
            pVar49.first.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                       )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                         )((this._M_cur)->super__Hash_node_base)._M_nxt;
          }
          CreateInfo = local_148;
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
              )this._M_cur !=
              _Var41.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
              ._M_cur) {
            uVar38 = (*(ulong *)((long)&((this._M_cur)->
                                        super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>
                                        ._M_storage._M_storage + 8) & 0x7fffffffffffffff) %
                     AllResources._M_h._M_bucket_count;
            p_Var10 = (__node_type *)AllResources._M_h._M_buckets[uVar38];
            p_Var11 = p_Var10;
            do {
              p_Var32 = p_Var11;
              p_Var11 = (__node_type *)(p_Var32->super__Hash_node_base)._M_nxt;
            } while (p_Var11 != this._M_cur);
            p_Var1 = ((this._M_cur)->super__Hash_node_base)._M_nxt;
            if (p_Var10 == p_Var32) {
              if (p_Var1 == (_Hash_node_base *)0x0) {
                uVar40 = 0;
              }
              else {
                uVar40 = ((ulong)p_Var1[2]._M_nxt & 0x7fffffffffffffff) %
                         AllResources._M_h._M_bucket_count;
                if (uVar40 == uVar38) goto LAB_006c6e9d;
              }
              if (p_Var1 != (_Hash_node_base *)0x0) {
                AllResources._M_h._M_buckets[uVar40] = (__node_base_ptr)p_Var10;
              }
              if (&AllResources._M_h._M_before_begin == AllResources._M_h._M_buckets[uVar38]) {
                AllResources._M_h._M_before_begin._M_nxt = p_Var1;
              }
              AllResources._M_h._M_buckets[uVar38] = (__node_base_ptr)0x0;
            }
            else if ((p_Var1 != (_Hash_node_base *)0x0) &&
                    (uVar40 = ((ulong)p_Var1[2]._M_nxt & 0x7fffffffffffffff) %
                              AllResources._M_h._M_bucket_count, uVar40 != uVar38)) {
              AllResources._M_h._M_buckets[uVar40] = &p_Var32->super__Hash_node_base;
            }
LAB_006c6e9d:
            (p_Var32->super__Hash_node_base)._M_nxt = ((this._M_cur)->super__Hash_node_base)._M_nxt;
            pcVar44 = (char *)AllResources._M_h._M_buckets;
            std::__detail::
            _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
            ::_M_deallocate_node
                      ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
                        *)this._M_cur,(__node_ptr)AllResources._M_h._M_buckets);
            AllResources._M_h._M_element_count = AllResources._M_h._M_element_count - 1;
          }
          local_14c = local_14c + 1;
          uVar38 = (ulong)local_14c;
        } while (local_14c < (CreateInfo->PSODesc).ResourceLayout.NumVariables);
      }
      pPVar47 = local_148;
      if (AllResources._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        LayoutDesc = &(local_148->PSODesc).ResourceLayout;
        _Var43._M_nxt = AllResources._M_h._M_before_begin._M_nxt;
        do {
          p_Var1 = _Var43._M_nxt[5]._M_nxt;
          bVar48 = *(SHADER_RESOURCE_VARIABLE_TYPE *)((long)&p_Var1[2]._M_nxt + 1) ==
                   LayoutDesc->DefaultVariableType;
          if (bVar48) {
LAB_006c6f07:
            if (!bVar48) goto LAB_006c6f48;
          }
          else {
            if ((*(char *)&p_Var1[2]._M_nxt == '\x06') &&
               (lVar33 = (*(code *)(_Var43._M_nxt[4]._M_nxt)->_M_nxt[4]._M_nxt)(),
               *(char *)(lVar33 + 0x25) == '\x01')) {
              pcVar44 = (char *)p_Var1->_M_nxt;
              SVar52 = FindPipelineResourceLayoutVariable
                                 (LayoutDesc,pcVar44,*(SHADER_TYPE *)&p_Var1[1]._M_nxt,
                                  *(char **)(lVar33 + 0x28));
              bVar48 = *(SHADER_RESOURCE_VARIABLE_TYPE *)((long)&p_Var1[2]._M_nxt + 1) ==
                       SVar52.Type;
              goto LAB_006c6f07;
            }
LAB_006c6f48:
            msg_1._M_dataplus._M_p = GetPipelineTypeString((pPVar47->PSODesc).PipelineType);
            local_120._M_dataplus._M_p = (pPVar47->PSODesc).super_DeviceObjectAttribs.Name;
            if (local_120._M_dataplus._M_p == (char *)0x0) {
              local_120._M_dataplus._M_p = "";
            }
            local_140 = GetShaderVariableTypeLiteralName
                                  (*(SHADER_RESOURCE_VARIABLE_TYPE *)((long)&p_Var1[2]._M_nxt + 1),
                                   false);
            local_128 = GetShaderVariableTypeLiteralName(LayoutDesc->DefaultVariableType,false);
            pcVar44 = "ValidatePipelineResourceSignatures";
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[50],char_const*,char[45],char_const*,char[73]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1a4,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x82578a,(char **)&local_120,(char (*) [15])"\' is invalid: ",
                       (char (*) [23])"The type of variable \'",(char **)p_Var1,
                       (char (*) [50])"\' not explicitly defined by the resource layout (",
                       (char **)&local_140,
                       (char (*) [45])") does not match the default variable type (",&local_128,
                       (char (*) [73])
                       "). This might indicate a bug in the serialization/deserialization logic.");
          }
          _Var43._M_nxt = (_Var43._M_nxt)->_M_nxt;
        } while (_Var43._M_nxt != (_Hash_node_base *)0x0);
      }
      local_14c = 0;
      pPVar47 = local_148;
      if ((local_148->PSODesc).ResourceLayout.NumImmutableSamplers != 0) {
        do {
          pPVar17 = local_148;
          pIVar12 = (pPVar47->PSODesc).ResourceLayout.ImmutableSamplers;
          uVar38 = (ulong)local_14c;
          if (pIVar12[uVar38].SamplerOrTextureName == (Char *)0x0) {
            msg_1._M_dataplus._M_p = GetPipelineTypeString((local_148->PSODesc).PipelineType);
            local_120._M_dataplus._M_p = (pPVar17->PSODesc).super_DeviceObjectAttribs.Name;
            if (local_120._M_dataplus._M_p == (char *)0x0) {
              local_120._M_dataplus._M_p = "";
            }
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[31]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1ac,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x82578a,(char **)&local_120,(char (*) [15])"\' is invalid: ",
                       (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_14c,
                       (char (*) [31])"].SamplerOrTextureName is null");
          }
          local_138 = &pIVar12[uVar38].SamplerOrTextureName;
          HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg_1,*local_138,false);
          pVar51 = std::
                   unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                   ::equal_range(&AllImtblSamplers,(key_type *)&msg_1);
          local_130._M_cur =
               (__node_type *)
               pVar51.second.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
               ._M_cur;
          _Var28._M_cur =
               (__node_type *)
               pVar51.first.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
               ._M_cur;
          if ((msg_1._M_dataplus._M_p != (pointer)0x0) && ((long)msg_1._M_string_length < 0)) {
            operator_delete__(msg_1._M_dataplus._M_p);
          }
          _Var35._M_cur = local_130._M_cur;
          if (_Var28._M_cur != local_130._M_cur) {
            pIVar12 = pIVar12 + uVar38;
            do {
              pPVar47 = local_148;
              SVar3 = *(SHADER_TYPE *)
                       ((long)&((_Var28._M_cur)->
                               super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                               ._M_storage._M_storage + 0x10);
              SVar4 = pIVar12->ShaderStages;
              if ((SVar3 != SVar4) && ((SVar4 & SVar3) != SHADER_TYPE_UNKNOWN)) {
                local_140 = GetPipelineTypeString((local_148->PSODesc).PipelineType);
                local_128 = (pPVar47->PSODesc).super_DeviceObjectAttribs.Name;
                if (local_128 == (char *)0x0) {
                  local_128 = "";
                }
                GetShaderStagesString_abi_cxx11_
                          (&msg_1,(Diligent *)(ulong)pIVar12->ShaderStages,ShaderStages_01);
                GetShaderStagesString_abi_cxx11_
                          (&local_120,(Diligent *)(ulong)pIVar12->ShaderStages,ShaderStages_02);
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[37],char_const*,char[35],std::__cxx11::string,char[70],std::__cxx11::string,char[73]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x1b9,(char (*) [16])"Description of ",(char **)&local_140,
                           (char (*) [7])0x82578a,&local_128,(char (*) [15])"\' is invalid: ",
                           (char (*) [37])"Shader stages of immutable sampler \'",local_138,
                           (char (*) [35])"\' defined by the resource layout (",&msg_1,
                           (char (*) [70])
                           ") do not match the stages defined by the implicit resource signatre (",
                           &local_120,
                           (char (*) [73])
                           "). This might indicate a bug in the serialization/deserialization logic."
                          );
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
                  operator_delete(local_120._M_dataplus._M_p,
                                  local_120.field_2._M_allocated_capacity + 1);
                }
                _Var35._M_cur = local_130._M_cur;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
                  operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
                  _Var35._M_cur = local_130._M_cur;
                }
              }
            } while (((SVar4 & SVar3) == SHADER_TYPE_UNKNOWN) &&
                    (_Var28._M_cur = (__node_type *)((_Var28._M_cur)->super__Hash_node_base)._M_nxt,
                    _Var28._M_cur != _Var35._M_cur));
          }
          pPVar47 = local_148;
          if (_Var28._M_cur == _Var35._M_cur) {
            msg_1._M_dataplus._M_p = GetPipelineTypeString((local_148->PSODesc).PipelineType);
            local_120._M_dataplus._M_p = (pPVar47->PSODesc).super_DeviceObjectAttribs.Name;
            if (local_120._M_dataplus._M_p == (char *)0x0) {
              local_120._M_dataplus._M_p = "";
            }
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[45],char_const*,char[58],char[70]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1c1,(char (*) [16])"Description of ",(char **)&msg_1,
                       (char (*) [7])0x82578a,(char **)&local_120,(char (*) [15])"\' is invalid: ",
                       (char (*) [45])"Resource layout contains immutable sampler \'",local_138,
                       (char (*) [58])"\' that is not present in the implicit resource signatre. ",
                       (char (*) [70])0x91e176);
          }
          uVar38 = (*(ulong *)((long)&((_Var28._M_cur)->
                                      super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>
                                      ._M_storage._M_storage + 8) & 0x7fffffffffffffff) %
                   AllImtblSamplers._M_h._M_bucket_count;
          p_Var6 = (__node_type *)AllImtblSamplers._M_h._M_buckets[uVar38];
          p_Var13 = p_Var6;
          do {
            p_Var34 = p_Var13;
            p_Var13 = (__node_type *)(p_Var34->super__Hash_node_base)._M_nxt;
          } while (p_Var13 != _Var28._M_cur);
          p_Var1 = ((_Var28._M_cur)->super__Hash_node_base)._M_nxt;
          if (p_Var6 == p_Var34) {
            if (p_Var1 == (_Hash_node_base *)0x0) {
              uVar40 = 0;
            }
            else {
              uVar40 = ((ulong)p_Var1[2]._M_nxt & 0x7fffffffffffffff) %
                       AllImtblSamplers._M_h._M_bucket_count;
              if (uVar40 == uVar38) goto LAB_006c7383;
            }
            if (p_Var1 != (_Hash_node_base *)0x0) {
              AllImtblSamplers._M_h._M_buckets[uVar40] = (__node_base_ptr)p_Var6;
            }
            if (&AllImtblSamplers._M_h._M_before_begin == AllImtblSamplers._M_h._M_buckets[uVar38])
            {
              AllImtblSamplers._M_h._M_before_begin._M_nxt = p_Var1;
            }
            AllImtblSamplers._M_h._M_buckets[uVar38] = (__node_base_ptr)0x0;
          }
          else if ((p_Var1 != (_Hash_node_base *)0x0) &&
                  (uVar40 = ((ulong)p_Var1[2]._M_nxt & 0x7fffffffffffffff) %
                            AllImtblSamplers._M_h._M_bucket_count, uVar40 != uVar38)) {
            AllImtblSamplers._M_h._M_buckets[uVar40] = &p_Var34->super__Hash_node_base;
          }
LAB_006c7383:
          (p_Var34->super__Hash_node_base)._M_nxt = ((_Var28._M_cur)->super__Hash_node_base)._M_nxt;
          pcVar44 = (char *)AllImtblSamplers._M_h._M_buckets;
          std::__detail::
          _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
          ::_M_deallocate_node
                    ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
                      *)_Var28._M_cur,(__node_ptr)AllImtblSamplers._M_h._M_buckets);
          AllImtblSamplers._M_h._M_element_count = AllImtblSamplers._M_h._M_element_count - 1;
          local_14c = local_14c + 1;
        } while (local_14c < (pPVar47->PSODesc).ResourceLayout.NumImmutableSamplers);
      }
      _Var9._M_nxt = AllImtblSamplers._M_h._M_before_begin._M_nxt;
      if (AllImtblSamplers._M_h._M_element_count != 0) {
        p_Var1 = AllImtblSamplers._M_h._M_before_begin._M_nxt[5]._M_nxt;
        msg_1._M_dataplus._M_p = GetPipelineTypeString((pPVar47->PSODesc).PipelineType);
        pcVar44 = (pPVar47->PSODesc).super_DeviceObjectAttribs.Name;
        local_120._M_dataplus._M_p = "";
        if (pcVar44 != (char *)0x0) {
          local_120._M_dataplus._M_p = pcVar44;
        }
        pcVar44 = "ValidatePipelineResourceSignatures";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[57],char_const*,char[47],char[70]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1ca,(char (*) [16])"Description of ",(char **)&msg_1,(char (*) [7])0x82578a,
                   (char **)&local_120,(char (*) [15])"\' is invalid: ",
                   (char (*) [57])"Implicit resource signature contains immutable sampler \'",
                   (char **)(p_Var1 + 1),
                   (char (*) [47])"\' that is not present in the resource layout. ",
                   (char (*) [70])0x91e176);
        _Var9 = AllImtblSamplers._M_h._M_before_begin;
      }
    }
    while ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
            *)_Var9._M_nxt !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
            *)0x0) {
      p_Var14 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
                  **)_Var9._M_nxt;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
      ::_M_deallocate_node
                ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>_>_>
                  *)_Var9._M_nxt,(__node_ptr)pcVar44);
      _Var9._M_nxt = (_Hash_node_base *)p_Var14;
    }
    __n_00 = (__node_ptr)0x0;
    memset(AllImtblSamplers._M_h._M_buckets,0,AllImtblSamplers._M_h._M_bucket_count << 3);
    AllImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllImtblSamplers._M_h._M_element_count = 0;
    _Var43._M_nxt = AllResources._M_h._M_before_begin._M_nxt;
    if (&AllImtblSamplers._M_h._M_single_bucket != AllImtblSamplers._M_h._M_buckets) {
      __n_00 = (__node_ptr)(AllImtblSamplers._M_h._M_bucket_count << 3);
      operator_delete(AllImtblSamplers._M_h._M_buckets,(ulong)__n_00);
      _Var43 = AllResources._M_h._M_before_begin;
    }
    while ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
            *)_Var43._M_nxt !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
            *)0x0) {
      p_Var15 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
                  **)_Var43._M_nxt;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
      ::_M_deallocate_node
                ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>_>_>
                  *)_Var43._M_nxt,__n_00);
      _Var43._M_nxt = (_Hash_node_base *)p_Var15;
    }
    memset(AllResources._M_h._M_buckets,0,AllResources._M_h._M_bucket_count << 3);
    AllResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AllResources._M_h._M_element_count = 0;
    if (&AllResources._M_h._M_single_bucket != AllResources._M_h._M_buckets) {
      operator_delete(AllResources._M_h._M_buckets,AllResources._M_h._M_bucket_count << 3);
    }
  }
  return;
}

Assistant:

void ValidatePipelineResourceSignatures(const PipelineStateCreateInfo& CreateInfo,
                                        const IRenderDevice*           pDevice) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    const RenderDeviceInfo& DeviceInfo = pDevice->GetDeviceInfo();
    const DeviceFeatures&   Features   = DeviceInfo.Features;

    const PipelineStateDesc& PSODesc = CreateInfo.PSODesc;

    const PSOCreateInternalInfo*    pInternalCI   = static_cast<const PSOCreateInternalInfo*>(CreateInfo.pInternalData);
    const PSO_CREATE_INTERNAL_FLAGS InternalFlags = pInternalCI != nullptr ? pInternalCI->Flags : PSO_CREATE_INTERNAL_FLAG_NONE;

    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0 && CreateInfo.ResourceSignaturesCount != 1)
        LOG_PSO_ERROR_AND_THROW("When PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0 flag is set, ResourceSignaturesCount (", CreateInfo.ResourceSignaturesCount, ") must be 1.");

    if (CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures == nullptr)
        LOG_PSO_ERROR_AND_THROW("ppResourceSignatures is null, but ResourceSignaturesCount (", CreateInfo.ResourceSignaturesCount, ") is not zero.");

    if (CreateInfo.ppResourceSignatures != nullptr && CreateInfo.ResourceSignaturesCount == 0)
        LOG_PSO_ERROR_AND_THROW("ppResourceSignatures is not null, but ResourceSignaturesCount is zero.");

    if (CreateInfo.ppResourceSignatures == nullptr)
        return;

    if (CreateInfo.PSODesc.SRBAllocationGranularity != 1)
    {
        LOG_WARNING_MESSAGE("PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning.");
    }

    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
    {
        if (CreateInfo.PSODesc.ResourceLayout.NumVariables != 0)
        {
            LOG_PSO_ERROR_AND_THROW("The number of variables defined through resource layout (", CreateInfo.PSODesc.ResourceLayout.NumVariables,
                                    ") must be zero when resource signatures are used.");
        }

        if (CreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers != 0)
        {
            LOG_PSO_ERROR_AND_THROW("The number of immutable samplers defined through resource layout (", CreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers,
                                    ") must be zero when resource signatures are used.");
        }
    }

    struct ResourceInfo
    {
        const SHADER_TYPE                 Stages;
        const IPipelineResourceSignature* pSign;
        const PipelineResourceDesc&       Desc;
    };
    struct ImtblSamInfo
    {
        const SHADER_TYPE                 Stages;
        const IPipelineResourceSignature* pSign;
        const ImmutableSamplerDesc&       Desc;
    };

    std::unordered_multimap<HashMapStringKey, ResourceInfo> AllResources;
    std::unordered_multimap<HashMapStringKey, ImtblSamInfo> AllImtblSamplers;

    std::array<const IPipelineResourceSignature*, MAX_RESOURCE_SIGNATURES> ppSignatures = {};
    for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
    {
        const IPipelineResourceSignature* const pSignature = CreateInfo.ppResourceSignatures[i];
        if (pSignature == nullptr)
            LOG_PSO_ERROR_AND_THROW("Pipeline resource signature at index ", i, " is null");

        const PipelineResourceSignatureDesc& SignDesc = pSignature->GetDesc();
        VERIFY(SignDesc.BindingIndex < MAX_RESOURCE_SIGNATURES,
               "Resource signature binding index exceeds the limit. This error should've been caught by ValidatePipelineResourceSignatureDesc.");

        if (ppSignatures[SignDesc.BindingIndex] != nullptr)
        {
            LOG_PSO_ERROR_AND_THROW("Pipeline resource signature '", pSignature->GetDesc().Name, "' at binding index ", Uint32{SignDesc.BindingIndex},
                                    " conflicts with another resource signature '", ppSignatures[SignDesc.BindingIndex]->GetDesc().Name,
                                    "' that uses the same index.");
        }
        ppSignatures[SignDesc.BindingIndex] = pSignature;

        for (Uint32 res = 0; res < SignDesc.NumResources; ++res)
        {
            const PipelineResourceDesc& ResDesc = SignDesc.Resources[res];
            VERIFY(ResDesc.Name != nullptr && ResDesc.Name[0] != '\0', "Resource name can't be null or empty. This should've been caught by ValidatePipelineResourceSignatureDesc()");
            VERIFY(ResDesc.ShaderStages != SHADER_TYPE_UNKNOWN, "Shader stages can't be UNKNOWN. This should've been caught by ValidatePipelineResourceSignatureDesc()");

            auto range = AllResources.equal_range(ResDesc.Name);
            for (auto it = range.first; it != range.second; ++it)
            {
                const ResourceInfo& OtherRes = it->second;
                if ((OtherRes.Stages & ResDesc.ShaderStages) != 0)
                {
                    VERIFY(OtherRes.pSign != pSignature, "Overlapping resources in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("Shader resource '", ResDesc.Name, "' is found in more than one resource signature ('", SignDesc.Name,
                                            "' and '", OtherRes.pSign->GetDesc().Name,
                                            "') in the same shader stage. Every shader resource in the PSO must be unambiguously defined by only one resource signature.");
                }

                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(OtherRes.Stages != SHADER_TYPE_UNKNOWN);
                    VERIFY(OtherRes.pSign != pSignature, "Resources with the same name in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but shader resource '", ResDesc.Name, "' is found in more than one resource signature ('",
                                            SignDesc.Name, "' and '", OtherRes.pSign->GetDesc().Name,
                                            "') in different stages. When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single resource for all stages.");
                }
            }
            AllResources.emplace(ResDesc.Name, ResourceInfo{ResDesc.ShaderStages, pSignature, ResDesc});
        }

        for (Uint32 res = 0; res < SignDesc.NumImmutableSamplers; ++res)
        {
            const ImmutableSamplerDesc& SamDesc = SignDesc.ImmutableSamplers[res];
            VERIFY(SamDesc.SamplerOrTextureName != nullptr && SamDesc.SamplerOrTextureName[0] != '\0', "Sampler name can't be null or empty. This should've been caught by ValidatePipelineResourceSignatureDesc()");
            VERIFY(SamDesc.ShaderStages != SHADER_TYPE_UNKNOWN, "Shader stage can't be UNKNOWN. This should've been caught by ValidatePipelineResourceSignatureDesc()");

            auto range = AllImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);
            for (auto it = range.first; it != range.second; ++it)
            {
                const ImtblSamInfo& OtherSam = it->second;
                if ((OtherSam.Stages & SamDesc.ShaderStages) != 0)
                {
                    VERIFY(OtherSam.pSign != pSignature, "Overlapping immutable samplers in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("Immutable sampler '", SamDesc.SamplerOrTextureName, "' is found in more than one resource signature ('", SignDesc.Name,
                                            "' and '", OtherSam.pSign->GetDesc().Name,
                                            "') in the same stage. Every immutable sampler in the PSO must be unambiguously defined by only one resource signature.");
                }

                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(OtherSam.Stages != SHADER_TYPE_UNKNOWN);
                    VERIFY(OtherSam.pSign != pSignature, "Immutable samplers with the same name in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but immutable sampler '", SamDesc.SamplerOrTextureName, "' is found in more than one resource signature ('",
                                            SignDesc.Name, "' and '", OtherSam.pSign->GetDesc().Name,
                                            "') in different stages. When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single immutable sampler for all stages.");
                }
            }
            AllImtblSamplers.emplace(SamDesc.SamplerOrTextureName, ImtblSamInfo{SamDesc.ShaderStages, pSignature, SamDesc});
        }
    }


    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0 &&
        // Deserialized default signatures are empty in OpenGL.
        !DeviceInfo.IsGLDevice())
    {
        const PipelineResourceLayoutDesc& ResLayout = CreateInfo.PSODesc.ResourceLayout;
        for (Uint32 i = 0; i < ResLayout.NumVariables; ++i)
        {
            const ShaderResourceVariableDesc& Var = ResLayout.Variables[i];
            if (Var.Name == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name is null");

            auto range = AllResources.equal_range(Var.Name);
            auto it    = range.first;
            for (; it != range.second; ++it)
            {
                const ResourceInfo& SignRes = it->second;
                if ((SignRes.Stages & Var.ShaderStages) == 0)
                    continue;

                if (SignRes.Stages != Var.ShaderStages)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader stages of variable '", Var.Name, "' defined by the resource layout (", GetShaderStagesString(Var.ShaderStages),
                                            ") do not match the stages defined by the implicit resource signature (", GetShaderStagesString(SignRes.Stages),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                if (SignRes.Desc.VarType != Var.Type)
                {
                    LOG_PSO_ERROR_AND_THROW("The type of variable '", Var.Name, "' defined by the resource layout (", GetShaderVariableTypeLiteralName(Var.Type),
                                            ") does not match the type defined by the implicit resource signature (", GetShaderVariableTypeLiteralName(SignRes.Desc.VarType),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                break;
            }

            if (it == range.second)
            {
                // It is OK - there may be variables in the resource layout
                // that don't present in any shader.
            }
            else
            {
                AllResources.erase(it);
            }
        }
        for (const auto& it : AllResources)
        {
            const PipelineResourceDesc& ResDesc = it.second.Desc;

            bool VarTypeOK = ResDesc.VarType == ResLayout.DefaultVariableType;
            if (!VarTypeOK && ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
            {
                const PipelineResourceSignatureDesc& SignDesc = it.second.pSign->GetDesc();
                if (SignDesc.UseCombinedTextureSamplers)
                {
                    const ShaderResourceVariableDesc RefDesc = FindPipelineResourceLayoutVariable(PSODesc.ResourceLayout, ResDesc.Name, ResDesc.ShaderStages, SignDesc.CombinedSamplerSuffix);
                    // The type of the immutable sampler must match the type of the texture variable it is assigned to
                    VarTypeOK = RefDesc.Type == ResDesc.VarType;
                }
            }
            if (!VarTypeOK)
            {
                LOG_PSO_ERROR_AND_THROW("The type of variable '", ResDesc.Name, "' not explicitly defined by the resource layout (", GetShaderVariableTypeLiteralName(ResDesc.VarType),
                                        ") does not match the default variable type (", GetShaderVariableTypeLiteralName(ResLayout.DefaultVariableType),
                                        "). This might indicate a bug in the serialization/deserialization logic.");
            }
        }

        for (Uint32 i = 0; i < ResLayout.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& ImtblSam = ResLayout.ImmutableSamplers[i];
            if (ImtblSam.SamplerOrTextureName == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName is null");
            auto range = AllImtblSamplers.equal_range(ImtblSam.SamplerOrTextureName);
            auto it    = range.first;
            for (; it != range.second; ++it)
            {
                const ImtblSamInfo& SignSam = it->second;
                if ((SignSam.Stages & ImtblSam.ShaderStages) == 0)
                    continue;

                if (SignSam.Stages != ImtblSam.ShaderStages)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader stages of immutable sampler '", ImtblSam.SamplerOrTextureName, "' defined by the resource layout (", GetShaderStagesString(ImtblSam.ShaderStages),
                                            ") do not match the stages defined by the implicit resource signatre (", GetShaderStagesString(ImtblSam.ShaderStages),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                break;
            }
            if (it == range.second)
            {
                LOG_PSO_ERROR_AND_THROW("Resource layout contains immutable sampler '", ImtblSam.SamplerOrTextureName, "' that is not present in the implicit resource signatre. ",
                                        "This might indicate a bug in the serialization/deserialization logic.");
            }

            AllImtblSamplers.erase(it);
        }
        if (!AllImtblSamplers.empty())
        {
            const ImmutableSamplerDesc& SamDesc = AllImtblSamplers.begin()->second.Desc;
            LOG_PSO_ERROR_AND_THROW("Implicit resource signature contains immutable sampler '", SamDesc.SamplerOrTextureName, "' that is not present in the resource layout. ",
                                    "This might indicate a bug in the serialization/deserialization logic.");
        }
    }
}